

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O2

Handle * __thiscall
leveldb::anon_unknown_0::ShardedLRUCache::Insert
          (ShardedLRUCache *this,Slice *key,void *value,size_t charge,
          _func_void_Slice_ptr_void_ptr *deleter)

{
  size_t *psVar1;
  HandleTable *this_00;
  size_t sVar2;
  bool bVar3;
  uint32_t uVar4;
  uint uVar5;
  LRUHandle *this_01;
  LRUHandle **ppLVar6;
  LRUHandle *pLVar7;
  uint uVar8;
  long lVar9;
  Mutex *__mutex;
  LRUCache *this_02;
  long in_FS_OFFSET;
  Slice local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = HashSlice(key);
  uVar8 = uVar4 >> 0x1c;
  this_02 = this->shard_ + uVar8;
  __mutex = &this->shard_[uVar8].mutex_;
  std::mutex::lock(&__mutex->mu_);
  sVar2 = key->size_;
  this_01 = (LRUHandle *)malloc(sVar2 + 0x47);
  this_01->value = value;
  this_01->deleter = deleter;
  this_01->charge = charge;
  this_01->key_length = sVar2;
  this_01->hash = uVar4;
  this_01->in_cache = false;
  this_01->refs = 1;
  lVar9 = 0;
  if (0x43 < sVar2 + 0x47) {
    lVar9 = sVar2 + 3;
  }
  __memcpy_chk(this_01->key_data,key->data_,sVar2,lVar9);
  if (this->shard_[uVar8].capacity_ == 0) {
    this_01->next = (LRUHandle *)0x0;
  }
  else {
    this_01->refs = 2;
    this_01->in_cache = true;
    this_01->next = &this->shard_[uVar8].in_use_;
    pLVar7 = this->shard_[uVar8].in_use_.prev;
    this_01->prev = pLVar7;
    pLVar7->next = this_01;
    this_01->next->prev = this_01;
    psVar1 = &this->shard_[uVar8].usage_;
    *psVar1 = *psVar1 + charge;
    this_00 = &this->shard_[uVar8].table_;
    local_48 = LRUHandle::key(this_01);
    ppLVar6 = HandleTable::FindPointer(this_00,&local_48,this_01->hash);
    pLVar7 = *ppLVar6;
    if (pLVar7 == (LRUHandle *)0x0) {
      this_01->next_hash = (LRUHandle *)0x0;
      *ppLVar6 = this_01;
      uVar5 = this->shard_[uVar8].table_.elems_ + 1;
      this->shard_[uVar8].table_.elems_ = uVar5;
      if (this->shard_[uVar8].table_.length_ < uVar5) {
        HandleTable::Resize(this_00);
      }
    }
    else {
      this_01->next_hash = pLVar7->next_hash;
      *ppLVar6 = this_01;
    }
    LRUCache::FinishErase(this_02,pLVar7);
  }
  do {
    if ((this->shard_[uVar8].usage_ <= this_02->capacity_) ||
       (pLVar7 = this->shard_[uVar8].lru_.next, pLVar7 == &this->shard_[uVar8].lru_)) {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return (Handle *)this_01;
      }
      __stack_chk_fail();
    }
    if (pLVar7->refs != 1) {
      __assert_fail("old->refs == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/util/cache.cc"
                    ,0x127,
                    "Cache::Handle *leveldb::(anonymous namespace)::LRUCache::Insert(const Slice &, uint32_t, void *, size_t, void (*)(const Slice &, void *))"
                   );
    }
    local_48 = LRUHandle::key(pLVar7);
    pLVar7 = HandleTable::Remove(&this->shard_[uVar8].table_,&local_48,pLVar7->hash);
    bVar3 = LRUCache::FinishErase(this_02,pLVar7);
  } while (bVar3);
  __assert_fail("erased",
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/util/cache.cc"
                ,0x12a,
                "Cache::Handle *leveldb::(anonymous namespace)::LRUCache::Insert(const Slice &, uint32_t, void *, size_t, void (*)(const Slice &, void *))"
               );
}

Assistant:

Handle* Insert(const Slice& key, void* value, size_t charge,
                 void (*deleter)(const Slice& key, void* value)) override {
    const uint32_t hash = HashSlice(key);
    return shard_[Shard(hash)].Insert(key, hash, value, charge, deleter);
  }